

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::HostMemoryAccess::execute
          (HostMemoryAccess *this,ExecuteContext *context)

{
  byte bVar1;
  void *pvVar2;
  deUint32 dVar3;
  ulong uVar4;
  Random rng;
  deRandom local_30;
  
  deRandom_init(&local_30,this->m_seed);
  pvVar2 = context->m_mapping;
  if (this->m_read == true) {
    if (this->m_write == true) {
      if (this->m_size != 0) {
        uVar4 = 0;
        do {
          dVar3 = deRandom_getUint32(&local_30);
          bVar1 = *(byte *)((long)pvVar2 + uVar4);
          (this->m_readData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4] = bVar1;
          *(byte *)((long)pvVar2 + uVar4) = (byte)dVar3 ^ bVar1;
          uVar4 = uVar4 + 1;
        } while (uVar4 < this->m_size);
      }
    }
    else if (this->m_size != 0) {
      uVar4 = 0;
      do {
        (this->m_readData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[uVar4] = *(uchar *)((long)pvVar2 + uVar4);
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_size);
    }
  }
  else if ((this->m_write == true) && (this->m_size != 0)) {
    uVar4 = 0;
    do {
      dVar3 = deRandom_getUint32(&local_30);
      *(char *)((long)pvVar2 + uVar4) = (char)dVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->m_size);
  }
  return;
}

Assistant:

void HostMemoryAccess::execute (ExecuteContext& context)
{
	de::Random		rng	(m_seed);
	deUint8* const	ptr	= (deUint8*)context.getMapping();

	if (m_read && m_write)
	{
		for (size_t pos = 0; pos < m_size; pos++)
		{
			const deUint8	mask	= rng.getUint8();
			const deUint8	value	= ptr[pos];

			m_readData[pos] = value;
			ptr[pos] = value ^ mask;
		}
	}
	else if (m_read)
	{
		for (size_t pos = 0; pos < m_size; pos++)
		{
			const deUint8	value	= ptr[pos];

			m_readData[pos] = value;
		}
	}
	else if (m_write)
	{
		for (size_t pos = 0; pos < m_size; pos++)
		{
			const deUint8	value	= rng.getUint8();

			ptr[pos] = value;
		}
	}
	else
		DE_FATAL("Host memory access without read or write.");
}